

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::LevelHelper::forEachLevel(EnumType *startIndex,function<bool_()> *fn)

{
  bool bVar1;
  function<bool_()> *in_RSI;
  uint *in_RDI;
  EnumType lIndexMax;
  
  do {
    bVar1 = el::base::utils::std::function<bool_()>::operator()(in_RSI);
    if (bVar1) {
      return;
    }
    *in_RDI = *in_RDI << 1;
  } while (*in_RDI < 0x81);
  return;
}

Assistant:

void LevelHelper::forEachLevel(base::type::EnumType* startIndex, const std::function<bool(void)>& fn) {
  base::type::EnumType lIndexMax = LevelHelper::kMaxValid;
  do {
    if (fn()) {
      break;
    }
    *startIndex = static_cast<base::type::EnumType>(*startIndex << 1);
  } while (*startIndex <= lIndexMax);
}